

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O2

AsmJsVarType Js::AsmJsVarType::FromCheckedType(AsmJsType type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  AsmJsVarType local_19;
  
  uVar4 = (ulong)type.which_;
  if ((Unsigned < type.which_) || ((0xefdU >> (type.which_ & (Float64x2|Floatish)) & 1) == 0)) {
    if (10 < type.which_ - Int32x4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                  ,0x159,
                                  "(type.isInt() || type.isMaybeDouble() || type.isFloatish() || type.isSIMDType())"
                                  ,
                                  "type.isInt() || type.isMaybeDouble() || type.isFloatish() || type.isSIMDType()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if ((Unsigned < type.which_) || ((0xefdU >> (type.which_ & (Float64x2|Floatish)) & 1) == 0))
    goto LAB_0087c72d;
  }
  uVar4 = (ulong)(byte)(&DAT_00f33990)[uVar4];
LAB_0087c72d:
  AsmJsVarType(&local_19,(Which)uVar4);
  return (AsmJsVarType)local_19.which_;
}

Assistant:

Js::AsmJsVarType AsmJsVarType::FromCheckedType(AsmJsType type)
    {
        Assert( type.isInt() || type.isMaybeDouble() || type.isFloatish() || type.isSIMDType());

        if (type.isMaybeDouble())
            return Double;
        else if (type.isFloatish())
            return Float;
        else if (type.isInt())
            return Int;
        else
        {
            // SIMD type
            return AsmJsVarType::Which(type.GetWhich());
        }

    }